

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawSchema * __thiscall capnp::SchemaLoader::Impl::loadNative(Impl *this,RawSchema *nativeSchema)

{
  Impl *schema_00;
  bool bVar1;
  RawSchema *pRVar2;
  RawSchema **ppRVar3;
  ChunkHeader *pCVar4;
  Dependency *pDVar5;
  size_t sVar6;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar7;
  uint local_2e4;
  uint i_1;
  RequiredSize *sizeReq;
  RequiredSize *local_2d0;
  RequiredSize *_sizeReq1376;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_2b8;
  undefined1 local_2a0 [8];
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> deps;
  undefined1 auStack_288 [4];
  uint i;
  ArrayPtr<const_capnp::_::RawSchema_*> dependencies;
  RawSchema temp;
  CompatibilityChecker checker;
  Reader native;
  Reader existing;
  Reader local_110;
  ArrayPtr<const_char> local_e0;
  Reader local_d0;
  ArrayPtr<const_char> local_a0;
  Fault local_90;
  Fault f;
  undefined1 local_80 [8];
  DebugComparison<const_capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> _kjCondition;
  RawSchema **match;
  RawSchema **local_48;
  RawSchema **_match1320;
  bool shouldClearInitializer;
  Impl *pIStack_38;
  bool shouldReplace;
  RawSchema *schema;
  RawSchema *nativeSchema_local;
  Impl *this_local;
  
  schema = nativeSchema;
  nativeSchema_local = (RawSchema *)this;
  kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long_const&>
            ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&match,(unsigned_long *)&this->schemas);
  local_48 = kj::_::readMaybe<capnp::_::RawSchema*>((Maybe<capnp::_::RawSchema_*&> *)&match);
  if (local_48 == (RawSchema **)0x0) {
    pIStack_38 = (Impl *)kj::Arena::allocate<capnp::_::RawSchema>(&this->arena);
    memset((RawBrandedSchema *)
           &(pIStack_38->dedupTable).
            super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
            indexes.erasedCount,0,0x28);
    ((RawBrandedSchema *)
    &(pIStack_38->dedupTable).
     super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes
     .erasedCount)->generic = (RawSchema *)pIStack_38;
    *(Initializer **)
     &(pIStack_38->dedupTable).
      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
      indexes = (Initializer *)0x0;
    (pIStack_38->schemas).table.rows.builder.ptr = (Entry *)0x0;
    _match1320._7_1_ = 1;
    _match1320._6_1_ = 0;
    kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::insert
              (&this->schemas,schema->id,(RawSchema *)pIStack_38);
  }
  else {
    pIStack_38 = (Impl *)*local_48;
    _kjCondition._32_8_ = local_48;
    if ((RawSchema *)
        (pIStack_38->dedupTable).
        super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows
        .builder.disposer != (RawSchema *)0x0) {
      f.exception = (Exception *)
                    kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                               (RawSchema **)
                               &(pIStack_38->dedupTable).
                                super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                                .rows.builder.disposer);
      kj::_::DebugExpression<capnp::_::RawSchema_const*&>::operator==
                ((DebugComparison<const_capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> *)
                 local_80,(DebugExpression<capnp::_::RawSchema_const*&> *)&f,&schema);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
      pRVar2 = schema;
      if (bVar1) {
        return (RawSchema *)pIStack_38;
      }
      readMessageUnchecked<capnp::schema::Node>(&local_d0,schema->encodedNode);
      local_a0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_d0);
      readMessageUnchecked<capnp::schema::Node>
                (&local_110,
                 ((RawSchema *)
                 (pIStack_38->dedupTable).
                 super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                 .rows.builder.disposer)->encodedNode);
      local_e0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_110);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawSchema_const*&,capnp::_::RawSchema_const*&>&,char_const(&)[53],unsigned_long_const&,capnp::Text::Reader,capnp::Text::Reader>
                (&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x531,FAILED,"schema->canCastTo == nativeSchema",
                 "_kjCondition,\"two different compiled-in type have the same type ID\", nativeSchema->id, readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(), readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName()"
                 ,(DebugComparison<const_capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> *)
                  local_80,(char (*) [53])"two different compiled-in type have the same type ID",
                 &pRVar2->id,(Reader *)&local_a0,(Reader *)&local_e0);
      kj::_::Debug::Fault::fatal(&local_90);
    }
    readMessageUnchecked<capnp::schema::Node>
              ((Reader *)&native._reader.nestingLimit,(word *)(pIStack_38->arena).chunkList);
    readMessageUnchecked<capnp::schema::Node>((Reader *)&checker.compatibility,schema->encodedNode);
    CompatibilityChecker::CompatibilityChecker
              ((CompatibilityChecker *)&temp.mayContainCapabilities,this);
    _match1320._7_1_ =
         CompatibilityChecker::shouldReplace
                   ((CompatibilityChecker *)&temp.mayContainCapabilities,
                    (Reader *)&native._reader.nestingLimit,(Reader *)&checker.compatibility,true);
    _match1320._6_1_ =
         *(Initializer **)
          &(pIStack_38->dedupTable).
           super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
           indexes != (Initializer *)0x0;
  }
  if ((_match1320._7_1_ & 1) == 0) {
    (pIStack_38->dedupTable).
    super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
    builder.disposer = (ArrayDisposer *)schema;
    for (local_2e4 = 0; local_2e4 < schema->dependencyCount; local_2e4 = local_2e4 + 1) {
      loadNative(this,schema->dependencies[local_2e4]);
    }
  }
  else {
    memcpy(&dependencies.size_,schema,0x78);
    temp.canCastTo =
         *(RawSchema **)
          &(pIStack_38->dedupTable).
           super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
           indexes;
    memcpy(pIStack_38,&dependencies.size_,0x71);
    ((RawBrandedSchema *)
    &(pIStack_38->dedupTable).
     super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes
     .erasedCount)->generic = (RawSchema *)pIStack_38;
    (pIStack_38->dedupTable).
    super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
    builder.disposer = (ArrayDisposer *)schema;
    _auStack_288 = kj::Arena::allocateArray<capnp::_::RawSchema_const*>
                             (&this->arena,
                              (ulong)*(uint *)&(pIStack_38->dedupTable).
                                               super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                                               .rows.builder.pos);
    for (deps.size_._4_4_ = 0; deps.size_._4_4_ < schema->dependencyCount;
        deps.size_._4_4_ = deps.size_._4_4_ + 1) {
      pRVar2 = loadNative(this,schema->dependencies[deps.size_._4_4_]);
      ppRVar3 = kj::ArrayPtr<const_capnp::_::RawSchema_*>::operator[]
                          ((ArrayPtr<const_capnp::_::RawSchema_*> *)auStack_288,
                           (ulong)deps.size_._4_4_);
      *ppRVar3 = pRVar2;
    }
    pCVar4 = (ChunkHeader *)
             kj::ArrayPtr<const_capnp::_::RawSchema_*>::begin
                       ((ArrayPtr<const_capnp::_::RawSchema_*> *)auStack_288);
    schema_00 = pIStack_38;
    (pIStack_38->arena).currentChunk = pCVar4;
    kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::ArrayPtr
              ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&_sizeReq1376);
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
              (&local_2b8,(ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&_sizeReq1376);
    AVar7 = makeBrandedDependencies(this,(RawSchema *)schema_00,&local_2b8);
    deps.ptr = (Dependency *)AVar7.size_;
    local_2a0 = (undefined1  [8])AVar7.ptr;
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_2b8);
    pDVar5 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::begin
                       ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_2a0);
    (pIStack_38->dedupTable).
    super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes.
    buckets.size_ = (size_t)pDVar5;
    sVar6 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::size
                      ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_2a0);
    *(uint32_t *)
     ((long)&(pIStack_38->dedupTable).
             super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
             .indexes.buckets.disposer + 4) = (uint32_t)sVar6;
    kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::find<unsigned_long_const&>
              ((HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize> *)&sizeReq,
               (unsigned_long *)&this->structSizeRequirements);
    local_2d0 = kj::_::readMaybe<capnp::SchemaLoader::Impl::RequiredSize>
                          ((Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> *)&sizeReq);
    if (local_2d0 != (RequiredSize *)0x0) {
      applyStructSizeRequirement
                (this,(RawSchema *)pIStack_38,(uint)local_2d0->dataWordCount,
                 (uint)local_2d0->pointerCount);
    }
  }
  if ((_match1320._6_1_ & 1) != 0) {
    *(Initializer **)
     &(pIStack_38->dedupTable).
      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
      indexes = (Initializer *)0x0;
    (pIStack_38->schemas).table.rows.builder.ptr = (Entry *)0x0;
  }
  return (RawSchema *)pIStack_38;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::loadNative(const _::RawSchema* nativeSchema) {
  _::RawSchema* schema;
  bool shouldReplace;
  bool shouldClearInitializer;
  KJ_IF_SOME(match, schemas.find(nativeSchema->id)) {
    schema = match;
    if (schema->canCastTo != nullptr) {
      // Already loaded natively, or we're currently in the process of loading natively and there
      // was a dependency cycle.
      KJ_REQUIRE(schema->canCastTo == nativeSchema,
          "two different compiled-in type have the same type ID",
          nativeSchema->id,
          readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(),
          readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName());
      return schema;
    } else {
      auto existing = readMessageUnchecked<schema::Node>(schema->encodedNode);
      auto native = readMessageUnchecked<schema::Node>(nativeSchema->encodedNode);
      CompatibilityChecker checker(*this);
      shouldReplace = checker.shouldReplace(existing, native, true);
      shouldClearInitializer = schema->lazyInitializer != nullptr;
    }
  } else {
    schema = &arena.allocate<_::RawSchema>();
    memset(&schema->defaultBrand, 0, sizeof(schema->defaultBrand));
    schema->defaultBrand.generic = schema;
    schema->lazyInitializer = nullptr;
    schema->defaultBrand.lazyInitializer = nullptr;
    shouldReplace = true;
    shouldClearInitializer = false;  // already cleared above
    schemas.insert(nativeSchema->id, schema);
  }